

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

unique_ptr<trompeloeil::expectation,_std::default_delete<trompeloeil::expectation>_> __thiscall
trompeloeil::call_validator_t<GenericOperation2Mock<bool,float,std::__cxx11::string_const&>const&>::
operator+(call_validator_t<GenericOperation2Mock<bool,float,std::__cxx11::string_const&>const&>
          *this,call_modifier<trompeloeil::call_matcher<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<bool,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_60,_trompeloeil::return_injector<bool,_trompeloeil::matcher_info<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                *t)

{
  undefined8 in_RDX;
  integral_constant<bool,_true> tag;
  bool valid_return_type;
  bool forbidden;
  bool retmatch;
  call_modifier<trompeloeil::call_matcher<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<bool,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_60,_trompeloeil::return_injector<bool,_trompeloeil::matcher_info<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *t_local;
  call_validator_t<const_GenericOperation2Mock<bool,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_&>
  *this_local;
  
  make_expectation<trompeloeil::call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>,GenericOperation2Mock<bool,float,std::__cxx11::string_const&>::trompeloeil_l_tag_type_trompeloeil_60,trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(float,std::__cxx11::string_const&)>>>
            (this,t,in_RDX);
  return (__uniq_ptr_data<trompeloeil::expectation,_std::default_delete<trompeloeil::expectation>,_true,_true>
          )(__uniq_ptr_data<trompeloeil::expectation,_std::default_delete<trompeloeil::expectation>,_true,_true>
            )this;
}

Assistant:

TROMPELOEIL_TRAILING_RETURN_TYPE(std::unique_ptr<expectation>)
    {
      using call = call_modifier<M, Tag, Info>;
      using sigret = return_of_t<typename call::signature>;
      using ret = typename call::return_type;
      constexpr bool retmatch = std::is_same<ret, sigret>::value;
      constexpr bool forbidden = call::upper_call_limit == 0;
      constexpr bool valid_return_type = call::throws || retmatch || forbidden;
      static_assert(valid_return_type, "RETURN missing for non-void function");
      auto tag = std::integral_constant<bool, valid_return_type>{};
      return make_expectation(tag, std::move(t));
    }